

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O0

btCollisionShape * __thiscall
btCollisionWorldImporter::createCapsuleShapeZ
          (btCollisionWorldImporter *this,btScalar radius,btScalar height)

{
  btCollisionShape *this_00;
  btCapsuleShapeZ *shape;
  btScalar in_stack_ffffffffffffffd8;
  btScalar in_stack_ffffffffffffffdc;
  btCapsuleShapeZ *in_stack_ffffffffffffffe0;
  
  this_00 = (btCollisionShape *)btCapsuleShape::operator_new(0x187789);
  btCapsuleShapeZ::btCapsuleShapeZ
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  btAlignedObjectArray<btCollisionShape_*>::push_back
            ((btAlignedObjectArray<btCollisionShape_*> *)this_00,(btCollisionShape **)this_00);
  return this_00;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createCapsuleShapeZ(btScalar radius, btScalar height)
{
	btCapsuleShapeZ* shape = new btCapsuleShapeZ(radius,height);
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}